

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_mb.cpp
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx::BVHNBuilderMBlurSAHGrid<4>::createPrimRefArrayMSMBlurGrid
          (PrimInfoMB *__return_storage_ptr__,BVHNBuilderMBlurSAHGrid<4> *this,Scene *scene,
          mvector<PrimRefMB> *prims,BuildProgressMonitor *progressMonitor,BBox1f t0t1)

{
  SubGridBuildData *ptr;
  PrimRefMB *ptr_00;
  MemoryMonitorInterface *pMVar1;
  mvector<PrimRefMB> *pmVar2;
  PrimInfoMB *pPVar3;
  char cVar4;
  int iVar5;
  size_t i_3;
  size_t sVar6;
  ulong uVar7;
  SubGridBuildData *pSVar8;
  PrimRefMB *pPVar9;
  runtime_error *prVar10;
  ulong uVar11;
  ulong uVar12;
  size_t i_2;
  long lVar13;
  size_t i_1;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *this_00;
  size_t N;
  ulong uVar17;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *pPVar18;
  size_t i;
  size_t sVar19;
  ulong uVar20;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *this_01;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar23 [64];
  anon_class_1_0_00000001 local_4ef9;
  mvector<PrimRefMB> *local_4ef8;
  ulong local_4ef0;
  BBox1f t0t1_local;
  size_t taskCount_1;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *local_4ed8;
  PrimInfoMB *local_4ed0;
  Iterator<embree::GridMesh,_true> *local_4ec8;
  size_t taskCount;
  Iterator<embree::GridMesh,_true> *local_4eb8;
  anon_class_8_1_898bcfc2_conflict10 local_4eb0;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *local_4ea8;
  mvector<PrimRefMB> *local_4ea0;
  Iterator<embree::GridMesh,_true> iter;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4e88;
  undefined4 local_4e78;
  undefined4 uStack_4e74;
  undefined4 uStack_4e70;
  undefined4 uStack_4e6c;
  undefined4 local_4e68;
  undefined4 uStack_4e64;
  undefined4 uStack_4e60;
  undefined4 uStack_4e5c;
  undefined4 local_4e58;
  undefined4 uStack_4e54;
  undefined4 uStack_4e50;
  undefined4 uStack_4e4c;
  undefined4 local_4e48;
  undefined4 uStack_4e44;
  undefined4 uStack_4e40;
  undefined4 uStack_4e3c;
  undefined4 local_4e38;
  undefined4 uStack_4e34;
  undefined4 uStack_4e30;
  undefined4 uStack_4e2c;
  undefined8 local_4e28;
  undefined8 uStack_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined4 local_4e08;
  undefined8 local_4e04;
  undefined4 local_4dfc;
  task_group_context context;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4d68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_4d58;
  Iterator<embree::GridMesh,_true> **local_4d50;
  anon_class_1_0_00000001 *local_4d48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_4d40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4cd8;
  undefined4 local_4cc8;
  undefined4 uStack_4cc4;
  undefined4 uStack_4cc0;
  undefined4 uStack_4cbc;
  undefined4 local_4cb8;
  undefined4 uStack_4cb4;
  undefined4 uStack_4cb0;
  undefined4 uStack_4cac;
  undefined4 local_4ca8;
  undefined4 uStack_4ca4;
  undefined4 uStack_4ca0;
  undefined4 uStack_4c9c;
  undefined4 local_4c98;
  undefined4 uStack_4c94;
  undefined4 uStack_4c90;
  undefined4 uStack_4c8c;
  undefined4 local_4c88;
  undefined4 uStack_4c84;
  undefined4 uStack_4c80;
  undefined4 uStack_4c7c;
  undefined8 local_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 uStack_4c60;
  undefined4 local_4c58;
  undefined8 local_4c54;
  undefined4 local_4c4c;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  
  auVar23._8_56_ = in_register_00001208;
  auVar23._0_8_ = t0t1;
  t0t1_local = (BBox1f)vmovlps_avx(auVar23._0_16_);
  pstate.super_ParallelForForState.taskCount = 0;
  context.my_cpu_ctl_env = (uint64_t)&iter;
  iter.all = false;
  sVar14 = (scene->geometries).size_active;
  uVar17 = 0;
  local_4ef8 = prims;
  local_4ed8 = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)this;
  local_4ed0 = __return_storage_ptr__;
  iter.scene = scene;
  for (sVar19 = 0; sVar14 != sVar19; sVar19 = sVar19 + 1) {
    sVar6 = ParallelForForState::init<embree::Scene::Iterator<embree::GridMesh,_true>_>::
            anon_class_8_1_4d25ca37::operator()((anon_class_8_1_4d25ca37 *)&context,sVar19);
    uVar17 = uVar17 + sVar6;
  }
  pstate.super_ParallelForForState.N = uVar17;
  iVar5 = tbb::detail::d1::max_concurrency();
  uVar11 = uVar17 + 0x3ff >> 10;
  if ((ulong)(long)iVar5 < uVar11) {
    uVar11 = (long)iVar5;
  }
  uVar7 = 0x40;
  if (uVar11 < 0x40) {
    uVar7 = uVar11;
  }
  sVar14 = 0;
  pstate.super_ParallelForForState.taskCount = uVar7 + (uVar7 == 0);
  pstate.super_ParallelForForState.i0[0] = 0;
  pstate.super_ParallelForForState.j0[0] = 0;
  uVar7 = uVar17 / pstate.super_ParallelForForState.taskCount;
  uVar11 = 1;
  uVar20 = 0;
  while (sVar19 = pstate.super_ParallelForForState.taskCount,
        uVar11 < pstate.super_ParallelForForState.taskCount) {
    sVar19 = ParallelForForState::init<embree::Scene::Iterator<embree::GridMesh,_true>_>::
             anon_class_8_1_4d25ca37::operator()((anon_class_8_1_4d25ca37 *)&context,sVar14);
    uVar15 = (uVar11 + 1) * uVar17;
    uVar16 = 0;
    uVar12 = uVar20;
    for (; ((uVar20 = (uVar12 + sVar19) - uVar16, uVar16 < sVar19 && (uVar7 <= uVar20)) &&
           (uVar11 < pstate.super_ParallelForForState.taskCount)); uVar11 = uVar11 + 1) {
      pstate.super_ParallelForForState.i0[uVar11] = sVar14;
      uVar16 = uVar16 + (uVar7 - uVar12);
      pstate.super_ParallelForForState.j0[uVar11] = uVar16;
      uVar20 = uVar15 / pstate.super_ParallelForForState.taskCount;
      uVar15 = uVar15 + uVar17;
      uVar12 = uVar7;
      uVar7 = uVar20;
    }
    sVar14 = sVar14 + 1;
  }
  local_4d58 = &local_4cd8;
  local_4cd8._0_8_ = 0x7f8000007f800000;
  local_4cd8.m128[2] = INFINITY;
  local_4cd8.m128[3] = INFINITY;
  local_4cc8 = 0xff800000;
  uStack_4cc4 = 0xff800000;
  uStack_4cc0 = 0xff800000;
  uStack_4cbc = 0xff800000;
  local_4cb8 = 0x7f800000;
  uStack_4cb4 = 0x7f800000;
  uStack_4cb0 = 0x7f800000;
  uStack_4cac = 0x7f800000;
  local_4ca8 = 0xff800000;
  uStack_4ca4 = 0xff800000;
  uStack_4ca0 = 0xff800000;
  uStack_4c9c = 0xff800000;
  local_4c98 = 0x7f800000;
  uStack_4c94 = 0x7f800000;
  uStack_4c90 = 0x7f800000;
  uStack_4c8c = 0x7f800000;
  local_4c88 = 0xff800000;
  uStack_4c84 = 0xff800000;
  uStack_4c80 = 0xff800000;
  uStack_4c7c = 0xff800000;
  local_4c78 = 0;
  uStack_4c70 = 0;
  uStack_4c68 = 0;
  uStack_4c60 = 0;
  local_4c58 = 0;
  auVar21._8_4_ = 0x3f800000;
  auVar21._0_8_ = 0x3f8000003f800000;
  auVar21._12_4_ = 0x3f800000;
  local_4c54 = vmovlps_avx(auVar21);
  local_4c4c = 0;
  local_4ec8 = (Iterator<embree::GridMesh,_true> *)&t0t1_local;
  local_4e88._0_8_ = &local_4ec8;
  local_4d50 = (Iterator<embree::GridMesh,_true> **)&taskCount_1;
  taskCount_1 = (size_t)&iter;
  local_4d40 = &local_4e88;
  local_4d68._8_8_ = &taskCount;
  local_4d68._0_8_ = &pstate;
  local_4d48 = &local_4ef9;
  taskCount = pstate.super_ParallelForForState.taskCount;
  local_4e88._8_8_ = taskCount_1;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_4eb0.func = (anon_class_48_6_afa08d2e_conflict2 *)&local_4d68;
  tbb::detail::d1::
  parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
            (0,sVar19,1,&local_4eb0,&context);
  cVar4 = tbb::detail::r1::is_group_execution_cancelled(&context);
  pPVar3 = local_4ed0;
  if (cVar4 != '\0') {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"task cancelled");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
            (pPVar3,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4cd8.field_1);
  this_00 = pstate.prefix_state.sums;
  this_01 = this_00;
  for (uVar17 = 0; pPVar18 = local_4ed8, uVar17 < taskCount; uVar17 = uVar17 + 1) {
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context,this_01 + -0x40);
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=(this_01,pPVar3);
    createPrimRefArrayMSMBlurGrid::anon_class_1_0_00000001::operator()
              ((PrimInfoMB *)&local_4d68.field_1,&local_4ef9,pPVar3,
               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context);
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
              (pPVar3,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d68.field_1);
    this_01 = this_01 + 1;
  }
  uVar17 = (pPVar3->object_range)._end - (pPVar3->object_range)._begin;
  if (uVar17 == 0) {
    return pPVar3;
  }
  uVar11 = ((mvector<SubGridBuildData> *)
           &(local_4ed8->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds)->size_alloced;
  uVar7 = uVar11;
  if ((uVar11 < uVar17) && (uVar20 = uVar11, uVar7 = uVar17, uVar11 != 0)) {
    for (; uVar7 = uVar20, uVar20 < uVar17; uVar20 = uVar20 * 2 + (ulong)(uVar20 * 2 == 0)) {
    }
  }
  if (uVar17 < ((mvector<SubGridBuildData> *)
               &(local_4ed8->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds)->
               size_active) {
    ((mvector<SubGridBuildData> *)
    &(local_4ed8->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds)->size_active = uVar17;
  }
  if (uVar11 == uVar7) {
    ((mvector<SubGridBuildData> *)
    &(local_4ed8->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds)->size_active = uVar17;
  }
  else {
    pMVar1 = (((mvector<SubGridBuildData> *)
              &(local_4ed8->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds)->alloc).
             device;
    ptr = (SubGridBuildData *)(local_4ed8->object_range)._begin;
    local_4ef0 = uVar7 * 8;
    (**pMVar1->_vptr_MemoryMonitorInterface)(pMVar1,local_4ef0,0);
    if (local_4ef0 < 0x1c00000) {
      pSVar8 = (SubGridBuildData *)alignedMalloc(local_4ef0,4);
    }
    else {
      pSVar8 = (SubGridBuildData *)
               os_malloc(local_4ef0,
                         &(((mvector<SubGridBuildData> *)
                           &(pPVar18->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds)->
                          alloc).hugepages);
    }
    (pPVar18->object_range)._begin = (unsigned_long)pSVar8;
    for (uVar11 = 0;
        uVar11 < ((mvector<SubGridBuildData> *)
                 &(pPVar18->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds)->size_active
        ; uVar11 = uVar11 + 1) {
      ((SubGridBuildData *)(pPVar18->object_range)._begin)[uVar11] = ptr[uVar11];
    }
    sVar14 = ((mvector<SubGridBuildData> *)
             &(pPVar18->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds)->size_alloced;
    if (ptr != (SubGridBuildData *)0x0) {
      local_4ef0 = sVar14;
      if (sVar14 * 8 < 0x1c00000) {
        alignedFree(ptr);
        sVar14 = local_4ef0;
      }
      else {
        os_free(ptr,sVar14 * 8,
                (((mvector<SubGridBuildData> *)
                 &(pPVar18->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds)->alloc).
                hugepages);
        sVar14 = local_4ef0;
      }
    }
    if (sVar14 != 0) {
      pMVar1 = (((mvector<SubGridBuildData> *)
                &(pPVar18->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds)->alloc).
               device;
      (**pMVar1->_vptr_MemoryMonitorInterface)(pMVar1,sVar14 * -8,1);
    }
    ((mvector<SubGridBuildData> *)
    &(pPVar18->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds)->size_active = uVar17;
    ((mvector<SubGridBuildData> *)
    &(pPVar18->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds)->size_alloced = uVar7;
  }
  pmVar2 = local_4ef8;
  uVar11 = local_4ef8->size_alloced;
  uVar7 = uVar11;
  if ((uVar11 < uVar17) && (uVar20 = uVar11, uVar7 = uVar17, uVar11 != 0)) {
    for (; uVar7 = uVar20, uVar20 < uVar17; uVar20 = uVar20 * 2 + (ulong)(uVar20 * 2 == 0)) {
    }
  }
  if (uVar17 < local_4ef8->size_active) {
    local_4ef8->size_active = uVar17;
  }
  if (uVar11 == uVar7) {
    local_4ef8->size_active = uVar17;
    goto LAB_00d0b771;
  }
  ptr_00 = local_4ef8->items;
  local_4ef0 = uVar17;
  if (uVar7 == 0) {
    sVar14 = 0;
LAB_00d0b6ce:
    pPVar9 = (PrimRefMB *)alignedMalloc(sVar14,0x10);
  }
  else {
    pMVar1 = (local_4ef8->alloc).device;
    sVar14 = uVar7 * 0x50;
    (**pMVar1->_vptr_MemoryMonitorInterface)(pMVar1,sVar14,0);
    if (sVar14 < 0x1c00000) goto LAB_00d0b6ce;
    pPVar9 = (PrimRefMB *)os_malloc(sVar14,&(pmVar2->alloc).hugepages);
  }
  local_4ef8->items = pPVar9;
  lVar13 = 0;
  for (uVar17 = 0; pPVar18 = local_4ed8, uVar17 < local_4ef8->size_active; uVar17 = uVar17 + 1) {
    PrimRefMB::PrimRefMB
              ((PrimRefMB *)((long)&(local_4ef8->items->lbounds).bounds0.lower.field_0 + lVar13),
               (PrimRefMB *)((long)&(ptr_00->lbounds).bounds0.lower.field_0 + lVar13));
    lVar13 = lVar13 + 0x50;
  }
  sVar14 = local_4ef8->size_alloced;
  if (ptr_00 != (PrimRefMB *)0x0) {
    if (sVar14 * 0x50 < 0x1c00000) {
      alignedFree(ptr_00);
    }
    else {
      os_free(ptr_00,sVar14 * 0x50,(local_4ef8->alloc).hugepages);
    }
  }
  if (sVar14 != 0) {
    pMVar1 = (local_4ef8->alloc).device;
    (**pMVar1->_vptr_MemoryMonitorInterface)(pMVar1,sVar14 * -0x50,1);
  }
  local_4ef8->size_active = local_4ef0;
  local_4ef8->size_alloced = uVar7;
LAB_00d0b771:
  sVar14 = pstate.super_ParallelForForState.taskCount;
  local_4e88._0_8_ = 0x7f8000007f800000;
  local_4e88._8_8_ = 0x7f8000007f800000;
  local_4e78 = 0xff800000;
  uStack_4e74 = 0xff800000;
  uStack_4e70 = 0xff800000;
  uStack_4e6c = 0xff800000;
  local_4e68 = 0x7f800000;
  uStack_4e64 = 0x7f800000;
  uStack_4e60 = 0x7f800000;
  uStack_4e5c = 0x7f800000;
  local_4e58 = 0xff800000;
  uStack_4e54 = 0xff800000;
  uStack_4e50 = 0xff800000;
  uStack_4e4c = 0xff800000;
  local_4e48 = 0x7f800000;
  uStack_4e44 = 0x7f800000;
  uStack_4e40 = 0x7f800000;
  uStack_4e3c = 0x7f800000;
  local_4e38 = 0xff800000;
  uStack_4e34 = 0xff800000;
  uStack_4e30 = 0xff800000;
  uStack_4e2c = 0xff800000;
  local_4e28 = 0;
  uStack_4e20 = 0;
  uStack_4e18 = 0;
  uStack_4e10 = 0;
  local_4e08 = 0;
  auVar22._8_4_ = 0x3f800000;
  auVar22._0_8_ = 0x3f8000003f800000;
  auVar22._12_4_ = 0x3f800000;
  local_4e04 = vmovlps_avx(auVar22);
  local_4dfc = 0;
  local_4eb0.func = (anon_class_48_6_afa08d2e_conflict2 *)&t0t1_local;
  local_4ec8 = &iter;
  taskCount = (size_t)&local_4eb0;
  taskCount_1 = pstate.super_ParallelForForState.taskCount;
  local_4d68._0_8_ = &pstate;
  local_4d68._8_8_ = &taskCount_1;
  local_4d58 = &local_4e88;
  local_4d50 = &local_4ec8;
  local_4d48 = &local_4ef9;
  local_4d40 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)&taskCount;
  local_4eb8 = local_4ec8;
  local_4ea8 = pPVar18;
  local_4ea0 = local_4ef8;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_4cd8._0_8_ = &local_4d68;
  tbb::detail::d1::
  parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
            (0,sVar14,1,(anon_class_8_1_898bcfc2_conflict10 *)&local_4cd8.field_1,&context);
  cVar4 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar4 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4cd8.field_1,
               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4e88.field_1);
    for (uVar17 = 0; pPVar3 = local_4ed0, uVar17 < taskCount_1; uVar17 = uVar17 + 1) {
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context,this_00 + -0x40);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
                (this_00,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4cd8.field_1);
      createPrimRefArrayMSMBlurGrid::anon_class_1_0_00000001::operator()
                ((PrimInfoMB *)&local_4d68.field_1,&local_4ef9,(PrimInfoMB *)&local_4cd8.field_1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4cd8.field_1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d68.field_1);
      this_00 = this_00 + 1;
    }
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
              (local_4ed0,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4cd8.field_1);
    pPVar3->time_range = t0t1_local;
    return pPVar3;
  }
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar10,"task cancelled");
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PrimInfoMB createPrimRefArrayMSMBlurGrid(Scene* scene, mvector<PrimRefMB>& prims, BuildProgressMonitor& progressMonitor, BBox1f t0t1 = BBox1f(0.0f,1.0f))
      {
        /* first run to get #primitives */
        ParallelForForPrefixSumState<PrimInfoMB> pstate;
        Scene::Iterator<GridMesh,true> iter(scene);

        pstate.init(iter,size_t(1024));
        /* iterate over all meshes in the scene */
        PrimInfoMB pinfoMB = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](GridMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfoMB {
            
            PrimInfoMB pinfoMB(empty);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              if (!mesh->valid(j, mesh->timeSegmentRange(t0t1))) continue;
              LBBox3fa bounds(empty);
              PrimInfoMB gridMB(0,mesh->getNumSubGrids(j));
              pinfoMB.merge(gridMB);
            }
            return pinfoMB;
          }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
        
        size_t numPrimitives = pinfoMB.size();
        if (numPrimitives == 0) return pinfoMB;

        /* resize arrays */
        sgrids.resize(numPrimitives); 
        prims.resize(numPrimitives); 
        /* second run to fill primrefs and SubGridBuildData arrays */
        pinfoMB = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](GridMesh* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB {
            
            k = base.size();
            size_t p_index = k;
            PrimInfoMB pinfoMB(empty);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              if (!mesh->valid(j, mesh->timeSegmentRange(t0t1))) continue;
              const GridMesh::Grid &g = mesh->grid(j);
              
              for (unsigned int y=0; y<g.resY-1u; y+=2)
                for (unsigned int x=0; x<g.resX-1u; x+=2)
                {
                  const PrimRefMB prim(mesh->linearBounds(g,x,y,t0t1),mesh->numTimeSegments(),mesh->time_range,mesh->numTimeSegments(),unsigned(geomID),unsigned(p_index));
                  pinfoMB.add_primref(prim);
                  sgrids[p_index] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
                  prims[p_index++] = prim;                
                }
            }
            return pinfoMB;
          }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
        
        assert(pinfoMB.size() == numPrimitives);
        pinfoMB.time_range = t0t1;
        return pinfoMB;
      }